

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::getNonsingularInverse(HEkk *this,HighsInt solve_phase)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  reference pvVar6;
  const_reference pvVar7;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  HighsInt i_1;
  HighsInt new_simplex_update_limit;
  HighsInt use_simplex_update_limit;
  HighsInt backtrack_rank_deficiency;
  uint64_t deficient_hash;
  bool artificial_rank_deficiency;
  HighsInt rank_deficiency;
  HighsInt i;
  HighsInt simplex_update_count;
  vector<int,_std::allocator<int>_> basicIndex_before_compute_factor;
  vector<int,_std::allocator<int>_> *basicIndex;
  HighsHashTable<unsigned_long,_void> *in_stack_ffffffffffffff50;
  HEkk *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  HighsInt in_stack_ffffffffffffff64;
  int local_74;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  unsigned_long *args;
  uint in_stack_ffffffffffffffa8;
  int local_50;
  HEkk *in_stack_ffffffffffffffc8;
  bool local_1;
  
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  uVar2 = *(uint *)(in_RDI + 0x2944);
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff58);
  for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x219c); local_50 = local_50 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20),(long)local_50)
    ;
    vVar1 = *pvVar6;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_50);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a38),(long)*pvVar7);
    *pvVar6 = vVar1;
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff58);
  uVar5 = computeFactor(in_stack_ffffffffffffffc8);
  if (uVar5 != 0) {
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,
                "HEkk::getNonsingularInverse Rank_deficiency: solve %d (Iteration %d)\n",
                (ulong)*(uint *)(in_RDI + 0x3860),(ulong)*(uint *)(in_RDI + 0x36f8));
  }
  in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
  if (uVar5 == 0) {
    putBacktrackingBasis
              ((HEkk *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff58);
    *(undefined1 *)(in_RDI + 0x2718) = 0;
    *(undefined4 *)(in_RDI + 0x2838) = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x17c);
  }
  else {
    args = *(unsigned_long **)(in_RDI + 0x29c0);
    bVar4 = getBacktrackingBasis(in_stack_ffffffffffffff58);
    if (!bVar4) {
      local_1 = false;
      goto LAB_00770972;
    }
    *(undefined1 *)(in_RDI + 0x2718) = 1;
    HighsHashTable<unsigned_long,_void>::clear(in_stack_ffffffffffffff50);
    HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
              ((HighsHashTable<unsigned_long,_void> *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),args
              );
    HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
              ((HighsHashTable<unsigned_long,_void> *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),args
              );
    updateStatus((HEkk *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (LpAction)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffff64 = computeFactor(in_stack_ffffffffffffffc8);
    if (in_stack_ffffffffffffff64 != 0) {
      local_1 = false;
      goto LAB_00770972;
    }
    if ((int)uVar2 < 2) {
      local_1 = false;
      goto LAB_00770972;
    }
    uVar3 = *(uint *)(in_RDI + 0x2838);
    *(int *)(in_RDI + 0x2838) = (int)uVar2 / 2;
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kWarning,
                "Rank deficiency of %d after %d simplex updates, so backtracking: max updates reduced from %d to %d\n"
                ,(ulong)uVar5,(ulong)uVar2,(ulong)uVar3,(int)uVar2 / 2);
  }
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff58);
  for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x219c); local_74 = local_74 + 1) {
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a38);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_74);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar7);
    in_stack_ffffffffffffff58 = (HEkk *)*pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20),(long)local_74)
    ;
    *pvVar6 = (value_type)in_stack_ffffffffffffff58;
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff58);
  local_1 = true;
LAB_00770972:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return local_1;
}

Assistant:

bool HEkk::getNonsingularInverse(const HighsInt solve_phase) {
  assert(status_.has_basis);
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;
  // Take a copy of basicIndex from before INVERT to be used as the
  // saved ordering of basic variables - so reinvert will run
  // identically.
  const vector<HighsInt> basicIndex_before_compute_factor = basicIndex;
  // Save the number of updates performed in case it has to be used to determine
  // a limit
  const HighsInt simplex_update_count = info_.update_count;
  // Dual simplex edge weights are identified with rows, so must be
  // permuted according to INVERT. Scatter the edge weights so that,
  // after INVERT, they can be gathered according to the new
  // permutation of basicIndex
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    scattered_dual_edge_weight_[basicIndex[i]] = dual_edge_weight_[i];
  analysis_.simplexTimerStop(PermWtClock);

  // Call computeFactor to perform INVERT
  HighsInt rank_deficiency = computeFactor();
  if (rank_deficiency)
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::getNonsingularInverse Rank_deficiency: solve %d (Iteration "
        "%d)\n",
        (int)debug_solve_call_num_, (int)iteration_count_);

  const bool artificial_rank_deficiency = false;  //  true;//
  if (artificial_rank_deficiency) {
    if (!info_.phase1_backtracking_test_done && solve_phase == kSolvePhase1) {
      // Claim rank deficiency to test backtracking
      // printf("Phase1 (Iter %" HIGHSINT_FORMAT
      //        ") Claiming rank deficiency to test backtracking\n",
      //        iteration_count_);
      rank_deficiency = 1;
      info_.phase1_backtracking_test_done = true;
    } else if (!info_.phase2_backtracking_test_done &&
               solve_phase == kSolvePhase2) {
      // Claim rank deficiency to test backtracking
      // printf("Phase2 (Iter %" HIGHSINT_FORMAT
      //        ") Claiming rank deficiency to test backtracking\n",
      //        iteration_count_);
      rank_deficiency = 1;
      info_.phase2_backtracking_test_done = true;
    }
  }
  if (rank_deficiency) {
    // Rank deficient basis, so backtrack to last full rank basis
    //
    // Get the last nonsingular basis - so long as there is one
    uint64_t deficient_hash = basis_.hash;
    if (!getBacktrackingBasis()) return false;
    // Record that backtracking is taking place
    info_.backtracking_ = true;
    visited_basis_.clear();
    visited_basis_.insert(basis_.hash);
    visited_basis_.insert(deficient_hash);
    this->updateStatus(LpAction::kBacktracking);
    HighsInt backtrack_rank_deficiency = computeFactor();
    // This basis has previously been inverted successfully, so it shouldn't be
    // singular
    if (backtrack_rank_deficiency) return false;
    // simplex update limit will be half of the number of updates
    // performed, so make sure that at least one update was performed
    if (simplex_update_count <= 1) return false;
    HighsInt use_simplex_update_limit = info_.update_limit;
    HighsInt new_simplex_update_limit = simplex_update_count / 2;
    info_.update_limit = new_simplex_update_limit;
    highsLogDev(options_->log_options, HighsLogType::kWarning,
                "Rank deficiency of %" HIGHSINT_FORMAT
                " after %" HIGHSINT_FORMAT
                " simplex updates, so "
                "backtracking: max updates reduced from %" HIGHSINT_FORMAT
                " to %" HIGHSINT_FORMAT "\n",
                rank_deficiency, simplex_update_count, use_simplex_update_limit,
                new_simplex_update_limit);
  } else {
    // Current basis is full rank so save it
    putBacktrackingBasis(basicIndex_before_compute_factor);
    // Indicate that backtracking is not taking place
    info_.backtracking_ = false;
    // Reset the update limit in case this is the first successful
    // inversion after backtracking
    info_.update_limit = options_->simplex_update_limit;
  }
  // Gather the edge weights according to the permutation of
  // basicIndex after INVERT
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    dual_edge_weight_[i] = scattered_dual_edge_weight_[basicIndex[i]];
  analysis_.simplexTimerStop(PermWtClock);
  return true;
}